

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
luna::Parse(luna *this,Lexer *lexer)

{
  String *pSVar1;
  TokenDetail *pTVar2;
  undefined8 *puVar3;
  ParseException *this_00;
  undefined1 local_80 [8];
  ParserImpl impl;
  
  impl.current_.field_0.number_ = 0.0;
  impl.current_.module_ = (String *)0x0;
  impl.current_.line_ = 0;
  impl.current_.column_ = 0;
  impl.current_.token_ = 0x11e;
  impl.look_ahead_.line_ = 0;
  impl.look_ahead_.column_ = 0;
  impl.look_ahead_.field_0.number_ = 0.0;
  impl.look_ahead_.module_ = (String *)0x0;
  impl.look_ahead_.token_ = 0x11e;
  impl.look_ahead2_.field_0.number_ = 0.0;
  impl.look_ahead2_.module_ = (String *)0x0;
  impl.look_ahead2_.line_ = 0;
  impl.look_ahead2_.column_ = 0;
  impl.look_ahead2_.token_ = 0x11e;
  impl.lexer_ = lexer;
  anon_unknown.dwarf_79cbb::ParserImpl::ParseBlock((ParserImpl *)local_80);
  pTVar2 = anon_unknown.dwarf_79cbb::ParserImpl::NextToken(&impl);
  if (pTVar2->token_ == 0x11e) {
    puVar3 = (undefined8 *)operator_new(0x18);
    pSVar1 = (impl.lexer_)->module_;
    *puVar3 = &PTR__Chunk_00198de8;
    puVar3[1] = local_80;
    puVar3[2] = pSVar1;
    *(undefined8 **)this = puVar3;
    return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           this;
  }
  this_00 = (ParseException *)__cxa_allocate_exception(0x20);
  ParseException::ParseException(this_00,"expect <eof>",&impl.current_);
  __cxa_throw(this_00,&ParseException::typeinfo,Exception::~Exception);
}

Assistant:

std::unique_ptr<SyntaxTree> Parse(Lexer *lexer)
    {
        ParserImpl impl(lexer);
        return impl.Parse();
    }